

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O3

double Js::NumberUtilities::Modulus(double dblLeft,double dblRight)

{
  double dVar1;
  
  if ((ulong)ABS(dblRight) < 0x7ff0000000000000) {
    dVar1 = NAN;
    if ((((dblRight != 0.0) || (NAN(dblRight))) &&
        ((~(ulong)dblLeft & 0x7ff0000000000000) != 0 || ((ulong)dblLeft & 0xfffffffffffff) == 0)) &&
       ((dblLeft != 0.0 || (dVar1 = dblLeft, NAN(dblLeft))))) {
      dVar1 = fmod(dblLeft,dblRight);
      return dVar1;
    }
  }
  else if ((~(ulong)dblRight & 0x7ff0000000000000) == 0 && ((ulong)dblRight & 0xfffffffffffff) != 0)
  {
    dVar1 = NAN;
  }
  else {
    dVar1 = dblLeft;
    if (0x7fefffffffffffff < (ulong)ABS(dblLeft)) {
      dVar1 = NAN;
    }
  }
  return dVar1;
}

Assistant:

double NumberUtilities::Modulus(double dblLeft, double dblRight)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_Rem_Double);
        double value = 0;

        if (!Js::NumberUtilities::IsFinite(dblRight))
        {
            if (NumberUtilities::IsNan(dblRight) || !Js::NumberUtilities::IsFinite(dblLeft))
            {
                value = NumberConstants::NaN;
            }
            else
            {
                value =  dblLeft;
            }
        }
        else if (0 == dblRight || NumberUtilities::IsNan(dblLeft))
        {
            value =  NumberConstants::NaN;
        }
        else if (0 == dblLeft)
        {
            value =  dblLeft;
        }
        else
        {
            value = fmod(dblLeft, dblRight);
        }

        return value;
        JIT_HELPER_END(Op_Rem_Double);
    }